

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_server.cpp
# Opt level: O1

int main(void)

{
  uint __fd;
  uint uVar1;
  int iVar2;
  undefined8 extraout_RAX;
  _Rb_tree<int,_std::pair<const_int,_ConnInfo>,_std::_Select1st<std::pair<const_int,_ConnInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>
  *unaff_R14;
  sockaddr_in server_addr;
  Conn conn;
  sockaddr local_88;
  Conn local_70;
  
  __fd = socket(2,1,0);
  if ((int)__fd < 0) {
    main_cold_4();
  }
  else {
    uVar1 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    local_88.sa_data[6] = '\0';
    local_88.sa_data[7] = '\0';
    local_88.sa_data[8] = '\0';
    local_88.sa_data[9] = '\0';
    local_88.sa_data[10] = '\0';
    local_88.sa_data[0xb] = '\0';
    local_88.sa_data[0xc] = '\0';
    local_88.sa_data[0xd] = '\0';
    local_88.sa_family = 2;
    local_88.sa_data[0] = '#';
    local_88.sa_data[1] = -0x7e;
    local_88.sa_data[2] = '\0';
    local_88.sa_data[3] = '\0';
    local_88.sa_data[4] = '\0';
    local_88.sa_data[5] = '\0';
    iVar2 = bind(__fd,&local_88,0x10);
    if (iVar2 == 0) {
      iVar2 = listen(__fd,0x400);
      if (iVar2 == 0) {
        local_70._epoll._vptr_Epoll = (_func_int **)&PTR__Epoll_00106da0;
        local_70._epoll._maxevents = -1;
        local_70._epoll._epfd = -1;
        local_70._epoll._events = (epoll_event *)0x0;
        local_70._listen_fd = -1;
        local_70._cur_conn_size = 0;
        local_70._max_conn_size = 0;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_70._conn_info_map._M_t._M_impl._0_8_ = 0;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_70._cur_handler = 0;
        local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_70._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Conn::init(&local_70,(EVP_PKEY_CTX *)(ulong)__fd);
        Conn::run(&local_70);
        close(__fd);
        main_cold_3();
        return 0;
      }
      goto LAB_00102de0;
    }
  }
  main_cold_1();
LAB_00102de0:
  main_cold_2();
  std::
  _Rb_tree<int,_std::pair<const_int,_ConnInfo>,_std::_Select1st<std::pair<const_int,_ConnInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>
  ::~_Rb_tree(unaff_R14);
  Epoll::~Epoll(&local_70._epoll);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main()
{
    int sock_fd = socket(AF_INET, SOCK_STREAM, 0);
    if (sock_fd < 0)
    {
        LOG_PRINT("create socket failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    int flags = fcntl(sock_fd, F_GETFL, 0);
    fcntl(sock_fd, F_SETFL, flags | O_NONBLOCK);

    struct sockaddr_in server_addr;
    memset(&server_addr, 0, sizeof(server_addr));
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = INADDR_ANY;
    server_addr.sin_port = htons(ServerPort);

    int ret = bind(sock_fd, (struct sockaddr *)&server_addr, sizeof(server_addr));
    if (ret != 0)
    {
        LOG_PRINT("bind sock failed, err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    ret = listen(sock_fd, MaxFdSize);
    if (ret != 0)
    {
        LOG_PRINT("listen sock failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }

    Conn conn;
    conn.init(sock_fd, MaxFdSize);
    conn.run();

    close(sock_fd);
    LOG_PRINT("server exit, status: %s", strerror(errno));

    return 0;
}